

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wthelper.h
# Opt level: O3

void __thiscall
WriterTestHelper<unsigned_char,_1U,_33321U>::resize
          (WriterTestHelper<unsigned_char,_1U,_33321U> *this,createFlags flags,ktx_uint32_t layers,
          ktx_uint32_t faces,ktx_uint32_t dimensions,ktx_uint32_t w,ktx_uint32_t h,ktx_uint32_t d,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *requestedColor)

{
  ktxHashList *ppkVar1;
  vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
  *this_00;
  pointer pwVar2;
  ktx_uint32_t ci;
  size_type __new_size;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  byte bVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  ktx_uint32_t kVar13;
  uint uVar14;
  ulong uVar15;
  vector<unsigned_char,_std::allocator<unsigned_char>_> color;
  ktxHashListEntry *pWriter;
  uint local_84;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  ulong local_50;
  long local_48;
  ulong local_40;
  undefined8 local_38;
  
  if (d != 1 && faces != 1) {
    __assert_fail("faces == 1 || d == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/wthelper.h"
                  ,0x53,
                  "void WriterTestHelper<unsigned char, 1, 33321>::resize(createFlags, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, std::vector<component_type> *) [component_type = unsigned char, numComponents = 1, internalformat = 33321]"
                 );
  }
  if ((requestedColor != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) &&
     ((requestedColor->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (requestedColor->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start)) {
    __assert_fail("requestedColor == nullptr || requestedColor->size() >= numComponents",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/wthelper.h"
                  ,0x54,
                  "void WriterTestHelper<unsigned char, 1, 33321>::resize(createFlags, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, std::vector<component_type> *) [component_type = unsigned char, numComponents = 1, internalformat = 33321]"
                 );
  }
  this->width = w;
  this->height = h;
  this->depth = d;
  uVar9 = 1;
  if ((flags & 1) != 0) {
    kVar13 = h;
    if (h < w) {
      kVar13 = w;
    }
    uVar9 = 1;
    if (kVar13 <= d) {
      kVar13 = d;
    }
    for (; kVar13 != 1; kVar13 = kVar13 >> 1) {
      uVar9 = uVar9 + 1;
    }
  }
  this->numLevels = uVar9;
  this->numLayers = layers;
  this->numFaces = faces;
  bVar12 = SUB41((flags & 4) >> 2,0);
  this->isArray = bVar12;
  (this->texinfo).super_wthTexInfo.super_ktxTextureCreateInfo.numLayers = layers;
  (this->texinfo).super_wthTexInfo.super_ktxTextureCreateInfo.numFaces = faces;
  (this->texinfo).super_wthTexInfo.super_ktxTextureCreateInfo.numLevels = uVar9;
  (this->texinfo).super_wthTexInfo.super_ktxTextureCreateInfo.numDimensions = dimensions;
  (this->texinfo).super_wthTexInfo.super_ktxTextureCreateInfo.generateMipmaps = false;
  (this->texinfo).super_wthTexInfo.super_ktxTextureCreateInfo.isArray = bVar12;
  (this->texinfo).super_wthTexInfo.super_ktxTextureCreateInfo.baseWidth = w;
  (this->texinfo).super_wthTexInfo.super_ktxTextureCreateInfo.baseHeight = h;
  (this->texinfo).super_wthTexInfo.super_ktxTextureCreateInfo.baseDepth = d;
  (this->texinfo).super_wthTexInfo.headerNumLayers = (int)(flags << 0x1d) >> 0x1f & layers;
  if (dimensions < 2) {
    h = 0;
  }
  (this->texinfo).super_wthTexInfo.headerPixelHeight = h;
  if (dimensions != 3) {
    d = 0;
  }
  (this->texinfo).super_wthTexInfo.headerPixelDepth = d;
  this->imageDataSize = 0;
  this_00 = &this->images;
  std::
  vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
  ::resize(this_00,(ulong)uVar9);
  std::vector<wthImageInfo,_std::allocator<wthImageInfo>_>::resize
            (&this->imageList,
             (ulong)(this->numLayers * this->numLevels * this->numFaces * this->depth));
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (byte *)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_68,1);
  if (requestedColor != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    *local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start =
         *(requestedColor->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
          _M_impl.super__Vector_impl_data._M_start;
  }
  if (this->numLevels != 0) {
    __new_size = (size_type)this->numLayers;
    uVar8 = 0;
    local_84 = 0;
    do {
      bVar6 = (byte)uVar8;
      uVar10 = this->width >> (bVar6 & 0x1f);
      uVar14 = this->height >> (bVar6 & 0x1f);
      uVar9 = this->depth >> (bVar6 & 0x1f);
      std::
      vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ::resize((this->images).
               super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar8,__new_size);
      if (this->numLayers == 0) {
        __new_size = 0;
      }
      else {
        uVar10 = (uVar14 + (uVar14 == 0)) * (uVar10 + (uVar10 == 0));
        local_48 = (long)(int)uVar10;
        lVar7 = *(long *)&(this_00->
                          super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar8].
                          super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        uVar11 = 0;
        do {
          uVar14 = this->numFaces;
          if (this->numFaces != 6) {
            uVar14 = uVar9 + (uVar9 == 0);
          }
          local_40 = (ulong)uVar14;
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::resize((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)(lVar7 + uVar11 * 0x18),local_40);
          lVar3 = *(long *)(*(long *)&(this_00->
                                      super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[uVar8].
                                      super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data + uVar11 * 0x18);
          uVar15 = 0;
          local_50 = uVar11;
          do {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       (lVar3 + uVar15 * 0x18),(ulong)uVar10);
            if (requestedColor == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
              *local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start = bVar6;
            }
            if (uVar10 != 0) {
              uVar4 = 0;
              do {
                *(uchar *)(*(long *)(*(long *)(*(long *)&(this_00->
                                                                                                                  
                                                  super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar8].
                                                  super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + uVar11 * 0x18)
                                    + uVar15 * 0x18) + uVar4) =
                     *local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
                uVar4 = uVar4 + 1;
              } while (uVar10 != uVar4);
            }
            uVar4 = (ulong)local_84;
            pwVar2 = (this->imageList).
                     super__Vector_base<wthImageInfo,_std::allocator<wthImageInfo>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pwVar2[uVar4].size = uVar10;
            this->imageDataSize = this->imageDataSize + local_48;
            lVar7 = *(long *)&(this->images).
                              super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar8].
                              super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            lVar3 = *(long *)(lVar7 + uVar11 * 0x18);
            local_84 = local_84 + 1;
            pwVar2[uVar4].data = *(GLubyte **)(lVar3 + uVar15 * 0x18);
            uVar15 = uVar15 + 1;
          } while (uVar15 != local_40);
          uVar11 = local_50 + 1;
          __new_size = (size_type)this->numLayers;
        } while (uVar11 < __new_size);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < this->numLevels);
  }
  if (dimensions == 1) {
    snprintf(this->orientation,0xf,"S=%c",0x72);
  }
  else if (dimensions == 2) {
    snprintf(this->orientation,0xf,"S=%c,T=%c",0x72,100);
  }
  else if (dimensions == 3) {
    snprintf(this->orientation,0xf,"S=%c,T=%c,R=%c",0x72,100,0x69);
  }
  builtin_strncpy(this->orientation_ktx2,"rdi",4);
  this->orientation_ktx2[dimensions] = '\0';
  ppkVar1 = &this->kvHash;
  ktxHashList_Construct(ppkVar1);
  sVar5 = strlen(this->orientation);
  ktxHashList_AddKVPair(ppkVar1,"KTXorientation",(int)sVar5 + 1,this->orientation);
  ktxHashList_Serialize(ppkVar1,&this->kvDataLen,&this->kvData);
  ppkVar1 = &this->kvHash_ktx2;
  ktxHashList_Construct(ppkVar1);
  ktxHashList_AddKVPair
            (ppkVar1,"KTXwriter",(int)(this->writer_ktx2)._M_string_length,
             (this->writer_ktx2)._M_dataplus._M_p);
  ktxHashList_FindEntry(ppkVar1,"KTXwriter",&local_38);
  appendLibId(ppkVar1,local_38);
  ktxHashList_Serialize(ppkVar1,&this->kvDataLenWriter_ktx2,&this->kvDataWriter_ktx2);
  ktxHashList_AddKVPair(ppkVar1,"KTXorientation",dimensions + 1,this->orientation_ktx2);
  ktxHashList_Sort(ppkVar1);
  ktxHashList_Serialize(ppkVar1,&this->kvDataLenAll_ktx2,&this->kvDataAll_ktx2);
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void resize(createFlags flags,
                ktx_uint32_t layers, ktx_uint32_t faces,
                ktx_uint32_t dimensions,
                ktx_uint32_t w, ktx_uint32_t h, ktx_uint32_t d,
                std::vector<component_type>* requestedColor = nullptr)
    {
        assert(faces == 1 || d == 1);
        assert(requestedColor == nullptr || requestedColor->size() >= numComponents);

        this->width = w;
        this->height = h;
        this->depth = d;
        numLevels = flags & eMipmapped? levelsFromSize(w, h, d): 1;
        this->numLayers = layers;
        this->numFaces=faces;
        isArray = flags & eArray ? true : false;
        texinfo.resize(numLevels, layers, faces, dimensions,
                       isArray, w, h, d);

        // Create the image set.
        imageDataSize = 0;
        images.resize(numLevels);
        imageList.resize(numLevels * numLayers * numFaces * depth);
        std::vector<component_type> color;
        color.resize(numComponents);
        if (requestedColor != nullptr) {
            for (ktx_uint32_t i = 0; i < numComponents; i++) {
                color[i] = (*requestedColor)[i];
            }
        }
        for (ktx_uint32_t level = 0, count = 0; level < numLevels; level++) {
            ktx_uint32_t levelWidth = MAX(1, width >> level);
            ktx_uint32_t levelHeight = MAX(1, height >> level);
            ktx_uint32_t levelDepth = MAX(1, depth >> level);
            images[level].resize(numLayers);
            for (ktx_uint32_t layer = 0; layer < numLayers; layer++) {
                ktx_uint32_t numImages = numFaces == 6 ? numFaces : levelDepth;
                images[level][layer].resize(numImages);
                for (ktx_uint32_t faceSlice = 0; faceSlice < numImages; faceSlice++) {
                    ktx_uint32_t componentCount, pixelCount;
                    pixelCount = levelWidth * levelHeight;
                    componentCount = pixelCount * numComponents;
                    images[level][layer][faceSlice].resize(componentCount);
                    // Using std::vector avoids warnings in the following
                    // switch due to access past the end of the array, if we
                    // were using an array and numComponents < 4.
                    if (requestedColor == nullptr) {
                        switch (numComponents) {
                          case 4:
                            color[3] = (component_type)0.5;
                            FALLTHROUGH;
                          case 3:
                            color[2] = (component_type)faceSlice;
                            FALLTHROUGH;
                          case 2:
                            color[1] = (component_type)layer;
                            FALLTHROUGH;
                          case 1:
                            color[0] = (component_type)level;
                            break;
                        }
                    }
                    for (ktx_uint32_t i = 0; i < pixelCount; i++) {
                        for (ktx_uint32_t j = 0; j < numComponents; j++) {
                            ktx_uint32_t ci = i * numComponents + j;
                            images[level][layer][faceSlice][ci] = color[j];
                        }
                    }
                    imageList[count].size
                         = pixelCount * numComponents * sizeof(component_type);
                    imageDataSize += imageList[count].size;
                    imageList[count++].data
                         = (GLubyte*)images[level][layer][faceSlice].data();
                }
            }
        }

        switch (dimensions) {
          case 1:
            assert(strlen(KTX_ORIENTATION1_FMT) < sizeof(orientation));
            snprintf(orientation, sizeof(orientation), KTX_ORIENTATION1_FMT,
                     'r');
            break;
          case 2:
            assert(strlen(KTX_ORIENTATION2_FMT) < sizeof(orientation));
            snprintf(orientation, sizeof(orientation), KTX_ORIENTATION2_FMT,
                     'r', 'd');
            break;
          case 3:
            assert(strlen(KTX_ORIENTATION3_FMT) < sizeof(orientation));
            snprintf(orientation, sizeof(orientation), KTX_ORIENTATION3_FMT,
                     'r', 'd', 'i');
            break;
        }
        assert(4 <= sizeof(orientation_ktx2));
        orientation_ktx2[0] = 'r';
        orientation_ktx2[1] = 'd';
        orientation_ktx2[2] = 'i';
        orientation_ktx2[3] = 0;
        orientation_ktx2[dimensions] = 0; // Ensure terminating NULL.

        ktxHashList_Construct(&kvHash);
        ktxHashList_AddKVPair(&kvHash, KTX_ORIENTATION_KEY,
                              (unsigned int)strlen(orientation) + 1,
                              orientation);
        ktxHashList_Serialize(&kvHash, &kvDataLen, &kvData);


        ktxHashList_Construct(&kvHash_ktx2);
        ktxHashList_AddKVPair(&kvHash_ktx2, KTX_WRITER_KEY,
                              (ktx_uint32_t)writer_ktx2.size(),
                              writer_ktx2.data());

        // Get the library to add its Id to the writer key so it will be
        // included in the serialized data.
        ktxHashListEntry* pWriter;
        ktxHashList_FindEntry(&kvHash_ktx2, KTX_WRITER_KEY,
                              &pWriter);
        appendLibId(&kvHash_ktx2, pWriter);

        ktxHashList_Serialize(&kvHash_ktx2, &kvDataLenWriter_ktx2, &kvDataWriter_ktx2);
        ktxHashList_AddKVPair(&kvHash_ktx2, KTX_ORIENTATION_KEY,
                              dimensions + 1,
                              orientation_ktx2);
        ktxHashList_Sort(&kvHash_ktx2);
        ktxHashList_Serialize(&kvHash_ktx2, &kvDataLenAll_ktx2, &kvDataAll_ktx2);
    }